

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 value;
  LogMessage *this_00;
  undefined8 in_RCX;
  uint8 *in_RDX;
  uint32 in_ESI;
  undefined8 *in_RDI;
  EpsCopyOutputStream *in_stack_00000120;
  uint8 *in_stack_00000128;
  int in_stack_00000134;
  Extension *in_stack_00000138;
  uint8 **in_stack_fffffffffffffed8;
  LogMessage *other;
  EpsCopyOutputStream *in_stack_fffffffffffffee0;
  LogMessage *in_stack_fffffffffffffef0;
  LogMessage local_100;
  undefined8 local_c8;
  uint8 *local_c0;
  uint32 local_b4;
  uint8 *local_a8;
  uint8 *local_a0;
  uint32 local_98;
  undefined4 local_94;
  uint8 *local_90;
  undefined4 local_88;
  undefined4 local_84;
  uint8 *local_80;
  uint32 local_74;
  undefined8 local_70;
  uint8 *local_68;
  long *local_60;
  undefined4 local_54;
  uint8 *local_50;
  undefined4 local_48;
  undefined4 local_44;
  uint8 *local_40;
  uint32 local_34;
  uint8 *local_30;
  uint32 local_24;
  uint8 *local_20;
  undefined4 local_14;
  uint8 *local_10;
  undefined4 local_4;
  
  if ((*(char *)(in_RDI + 1) == '\v') && ((*(byte *)((long)in_RDI + 9) & 1) == 0)) {
    local_a8 = in_RDX;
    if ((*(byte *)((long)in_RDI + 10) & 1) == 0) {
      local_c8 = in_RCX;
      local_c0 = in_RDX;
      local_b4 = in_ESI;
      io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_4 = 0xb;
      local_10 = local_c0;
      local_c0 = io::CodedOutputStream::WriteVarint32ToArray(0xb,local_c0);
      local_94 = 2;
      local_98 = local_b4;
      local_84 = 2;
      local_88 = 0;
      local_a0 = local_c0;
      local_90 = local_c0;
      local_24 = WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
      local_30 = local_90;
      local_a0 = io::CodedOutputStream::WriteVarint32ToArray(local_24,local_90);
      local_74 = local_98;
      local_80 = local_a0;
      local_c0 = io::CodedOutputStream::WriteVarint32ToArray(local_98,local_a0);
      if ((*(byte *)((long)in_RDI + 10) >> 4 & 1) == 0) {
        local_60 = (long *)*in_RDI;
        local_54 = 3;
        local_70 = local_c8;
        local_44 = 3;
        local_48 = 2;
        local_68 = local_c0;
        local_50 = local_c0;
        local_34 = WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
        local_40 = local_50;
        local_68 = io::CodedOutputStream::WriteVarint32ToArray(local_34,local_50);
        value = (**(code **)(*local_60 + 0x60))();
        local_68 = io::CodedOutputStream::WriteVarint32ToArray(value,local_68);
        local_c0 = (uint8 *)(**(code **)(*local_60 + 0x70))(local_60,local_68,local_70);
      }
      else {
        local_c0 = (uint8 *)(**(code **)(*(long *)*in_RDI + 0x88))
                                      ((long *)*in_RDI,3,local_c0,local_c8);
      }
      io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_14 = 0xc;
      local_20 = local_c0;
      local_a8 = io::CodedOutputStream::WriteVarint32ToArray(0xc,local_c0);
    }
  }
  else {
    other = &local_100;
    LogMessage::LogMessage
              (in_stack_fffffffffffffef0,(LogLevel_conflict)((ulong)in_RDI >> 0x20),
               (char *)in_stack_fffffffffffffee0,(int)((ulong)other >> 0x20));
    this_00 = LogMessage::operator<<((LogMessage *)in_stack_fffffffffffffee0,(char *)other);
    LogFinisher::operator=((LogFinisher *)this_00,other);
    LogMessage::~LogMessage((LogMessage *)0x4a15ed);
    local_a8 = InternalSerializeFieldWithCachedSizesToArray
                         (in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000120);
  }
  return local_a8;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, uint8* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, target, stream);
  }

  if (is_cleared) return target;

  stream->EnsureSpace(&target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->WriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, *message_value, target,
        stream);
  }
  // End group.
  stream->EnsureSpace(&target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}